

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O1

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::display_tikz
          (AttentionalModel<dynet::LSTMBuilder> *this,vector<int,_std::allocator<int>_> *source,
          vector<int,_std::allocator<int>_> *target,ComputationGraph *cg,Expression *alignment,
          Dict *sd,Dict *td)

{
  pointer piVar1;
  pointer piVar2;
  pointer pbVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  Tensor *pTVar7;
  ostream *poVar8;
  uint i;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  float fVar13;
  undefined1 auVar14 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar15 [16];
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar16 [16];
  int local_88;
  uint local_68 [2];
  Tensor *local_60;
  uint local_58;
  Dim local_54;
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qb;
  
  uVar6 = (ulong)((long)(target->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(target->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  piVar1 = (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar2 = (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_58 = (alignment->i).t;
  pTVar7 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)cg);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," x ",3);
  local_60 = pTVar7;
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  auVar16 = std::ostream::flush();
  auVar15._0_8_ = auVar16._8_8_;
  auVar14._0_8_ = auVar16._0_8_;
  auVar15._8_8_ = extraout_XMM1_Qb;
  auVar14._8_56_ = extraout_var;
  auVar16 = auVar14._0_16_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\\begin{tikzpicture}[scale=0.5]\n",0x1f);
  uVar9 = (uint)((ulong)((long)piVar1 - (long)piVar2) >> 2);
  local_88 = (int)uVar6;
  if (uVar9 != 0) {
    auVar16 = vcvtusi2sd_avx512f(auVar16,local_88);
    lVar12 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\\node[anchor=west,rotate=90] at (",0x21);
      auVar4 = vcvtusi2sd_avx512f(auVar15,(int)lVar12);
      poVar8 = std::ostream::_M_insert<double>(auVar4._0_8_ + 0.5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      poVar8 = std::ostream::_M_insert<double>(auVar16._0_8_ + 0.2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") { ",4);
      iVar10 = (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      pbVar3 = (sd->words_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(sd->words_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) >> 5) <=
          iVar10) goto LAB_0013a7fb;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,pbVar3[iVar10]._M_dataplus._M_p,pbVar3[iVar10]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," };\n",4);
      lVar12 = lVar12 + 1;
    } while (uVar9 != (uint)lVar12);
  }
  if (local_88 != 0) {
    auVar16 = vcvtusi2sd_avx512f(auVar15,uVar9);
    lVar12 = 0;
    uVar6 = uVar6 & 0xffffffff;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\\node[anchor=west] at (",0x17);
      poVar8 = std::ostream::_M_insert<double>(auVar16._0_8_ + 0.2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      auVar4 = vcvtusi2sd_avx512f(auVar15,(int)uVar6);
      poVar8 = std::ostream::_M_insert<double>(auVar4._0_8_ + -0.5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") { ",4);
      iVar10 = *(int *)((long)(target->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar12);
      pbVar3 = (td->words_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(td->words_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) >> 5) <=
          iVar10) {
LAB_0013a7fb:
        __assert_fail("id < (int)words_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/dict.h"
                      ,0x33,"const std::string &dynet::Dict::convert(const int &) const");
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,pbVar3[iVar10]._M_dataplus._M_p,pbVar3[iVar10]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," };\n",4);
      lVar12 = lVar12 + 4;
      uVar11 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar11;
    } while (uVar11 != 0);
    iVar10 = 0;
    do {
      if (uVar9 != 0) {
        auVar16 = vcvtusi2ss_avx512f(auVar15,(local_88 - iVar10) + -1);
        auVar4 = vcvtusi2ss_avx512f(auVar15,local_88 - iVar10);
        uVar11 = 0;
        do {
          local_68[0] = uVar11;
          local_68[1] = iVar10;
          local_54.nd = 0;
          local_54.bd = 1;
          lVar12 = 0;
          do {
            uVar6 = local_54._28_8_ & 0xffffffff;
            local_54.nd = local_54.nd + 1;
            local_54.d[uVar6] = *(uint *)((long)local_68 + lVar12);
            lVar12 = lVar12 + 4;
          } while (lVar12 != 8);
          fVar13 = (float)dynet::TensorTools::AccessElement(local_60,&local_54);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\\fill[blue!",0xb);
          poVar8 = (ostream *)std::ostream::operator<<(&std::cout,(int)(fVar13 * 100.0));
          auVar15._8_8_ = extraout_XMM1_Qb_00;
          auVar15._0_8_ = extraout_XMM1_Qa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!black] (",9);
          auVar5 = vcvtusi2ss_avx512f(auVar15,uVar11);
          poVar8 = std::ostream::_M_insert<double>((double)(auVar5._0_4_ + 0.01));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
          poVar8 = std::ostream::_M_insert<double>((double)(auVar16._0_4_ + 0.01));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") rectangle (",0xd);
          uVar11 = uVar11 + 1;
          auVar5 = vcvtusi2ss_avx512f(auVar15,uVar11);
          poVar8 = std::ostream::_M_insert<double>((double)(auVar5._0_4_ + -0.01));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
          poVar8 = std::ostream::_M_insert<double>((double)(auVar4._0_4_ + -0.01));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,");\n",3);
        } while (uVar11 != uVar9);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != local_88);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\\draw[step=1cm,color=gray] (0,0) grid (",0x27);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\\end{tikzpicture}\n",0x12);
  return;
}

Assistant:

void 
AttentionalModel<Builder>::display_tikz(const std::vector<int> &source, const std::vector<int>& target, 
                          ComputationGraph &cg, const Expression &alignment, Dict &sd, Dict &td)
{
    using namespace std;

    // display the alignment
    unsigned I = target.size();
    unsigned J = source.size();

    const Tensor &a = cg.get_value(alignment.i);
    cout << a.d[0] << " x " << a.d[1] << endl;

    cout << "\\begin{tikzpicture}[scale=0.5]\n";
    for (unsigned j = 0; j < J; ++j) 
        cout << "\\node[anchor=west,rotate=90] at (" << j+0.5 << ", " << I+0.2 << ") { " << sd.convert(source[j]) << " };\n";
    for (unsigned i = 0; i < I; ++i) 
        cout << "\\node[anchor=west] at (" << J+0.2 << ", " << I-i-0.5 << ") { " << td.convert(target[i]) << " };\n";

    float eps = 0.01;
    for (unsigned i = 0; i < I; ++i) {
        for (unsigned j = 0; j < J; ++j) {
            float v = TensorTools::AccessElement(a, Dim({(unsigned int)j, (unsigned int)i}));
            //int val = int(pow(v, 0.5) * 100);
            int val = int(v * 100);
            cout << "\\fill[blue!" << val << "!black] (" << j+eps << ", " << I-i-1+eps << ") rectangle (" << j+1-eps << "," << I-i-eps << ");\n";
        }
    }
    cout << "\\draw[step=1cm,color=gray] (0,0) grid (" << J << ", " << I << ");\n";
    cout << "\\end{tikzpicture}\n";
}